

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

void __thiscall re2::SparseArray<int>::create_index(SparseArray<int> *this,int i)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  IndexValue *pIVar5;
  int i_local;
  SparseArray<int> *this_local;
  
  bVar2 = has_index(this,i);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!has_index(i)",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/sparse_array.h"
                  ,0x16a,"void re2::SparseArray<int>::create_index(int) [Value = int]");
  }
  iVar1 = this->size_;
  iVar3 = max_size(this);
  if (iVar1 < iVar3) {
    iVar1 = this->size_;
    piVar4 = PODArray<int>::operator[](&this->sparse_,i);
    *piVar4 = iVar1;
    pIVar5 = PODArray<re2::SparseArray<int>::IndexValue>::operator[](&this->dense_,this->size_);
    pIVar5->index_ = i;
    this->size_ = this->size_ + 1;
    return;
  }
  __assert_fail("size_ < max_size()",
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/sparse_array.h"
                ,0x16b,"void re2::SparseArray<int>::create_index(int) [Value = int]");
}

Assistant:

void SparseArray<Value>::create_index(int i) {
  assert(!has_index(i));
  assert(size_ < max_size());
  sparse_[i] = size_;
  dense_[size_].index_ = i;
  size_++;
}